

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O1

void __thiscall node::first_instruction(node *this)

{
  long lVar1;
  bool bVar2;
  pointer pbVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  bool bVar7;
  string local_50;
  
  this->no_code = false;
  pbVar3 = (this->inputCode).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  bVar7 = (this->inputCode).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish != pbVar3;
  if (bVar7) {
    lVar6 = 8;
    uVar5 = 0;
    do {
      lVar1 = *(long *)((long)pbVar3 + lVar6 + -8);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,lVar1,
                 *(long *)((long)&(pbVar3->_M_dataplus)._M_p + lVar6) + lVar1);
      bVar2 = is_whitespace(&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (!bVar2) {
        this->pc = (int8_t)uVar5;
        if (bVar7) {
          return;
        }
        break;
      }
      uVar5 = uVar5 + 1;
      pbVar3 = (this->inputCode).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar4 = (long)(this->inputCode).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5;
      lVar6 = lVar6 + 0x20;
      bVar7 = uVar5 < uVar4;
    } while (uVar5 < uVar4);
  }
  this->pc = '\0';
  this->no_code = true;
  return;
}

Assistant:

void node::first_instruction(){
  no_code=false;
  for(int i=0;i<inputCode.size();i++){
    if(!is_whitespace(inputCode[i])){
      pc=i;
      return;
    }
  }
  pc=0;
  no_code=true;
  return;
}